

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codec.cpp
# Opt level: O2

void CodeSpectralEnvelope
               (double **spectrogram,int f0_length,int fs,int fft_size,int number_of_dimensions,
               double **coded_spectral_envelope)

{
  uint fft_size_00;
  uint x_length;
  uint uVar1;
  double *xi;
  double *x;
  double *y;
  double *pdVar2;
  ulong uVar3;
  double *yi;
  ulong uVar4;
  double *pdVar5;
  int j;
  long lVar6;
  ulong uVar7;
  long lVar8;
  fft_plan *pfVar9;
  undefined8 *puVar10;
  double *pdVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  byte bVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double __x;
  fft_plan in_stack_fffffffffffffe98;
  ForwardRealFFT forward_real_fft;
  
  bVar16 = 0;
  fft_size_00 = fft_size / 2;
  lVar6 = (long)(int)fft_size_00;
  uVar13 = 0xffffffffffffffff;
  uVar12 = lVar6 << 4;
  uVar15 = lVar6 * 8;
  if (fft_size < -1) {
    uVar12 = uVar13;
    uVar15 = uVar13;
  }
  xi = (double *)operator_new__(uVar15);
  x_length = fft_size_00 + 1;
  uVar15 = lVar6 * 8 + 8;
  if (fft_size < -3) {
    uVar15 = uVar13;
  }
  x = (double *)operator_new__(uVar15);
  y = (double *)operator_new__(uVar15);
  pdVar2 = (double *)operator_new__(uVar12);
  dVar21 = (double)fs * 0.5;
  if (20000.0 <= dVar21) {
    dVar21 = 20000.0;
  }
  dVar17 = anon_unknown.dwarf_e3c::FrequencyToMel(40.0);
  dVar21 = anon_unknown.dwarf_e3c::FrequencyToMel(dVar21);
  __x = (double)fft_size;
  uVar13 = 0;
  uVar15 = 0;
  if (0 < (int)fft_size_00) {
    uVar15 = (ulong)fft_size_00;
  }
  pdVar11 = pdVar2 + 1;
  for (; uVar15 != uVar13; uVar13 = uVar13 + 1) {
    xi[uVar13] = ((dVar21 - dVar17) * (double)(int)uVar13) / (double)(int)fft_size_00 + dVar17;
    dVar18 = ((double)(int)uVar13 * 3.141592653589793) / __x;
    dVar19 = cos(dVar18);
    dVar20 = SQRT(__x);
    if (__x < 0.0) {
      dVar20 = sqrt(__x);
    }
    pdVar11[-1] = (dVar19 + dVar19) / dVar20;
    dVar18 = sin(dVar18);
    dVar20 = SQRT(__x);
    if (__x < 0.0) {
      dVar20 = sqrt(__x);
    }
    *pdVar11 = (dVar18 + dVar18) / dVar20;
    pdVar11 = pdVar11 + 2;
  }
  *pdVar2 = *pdVar2 / 1.4142135623730951;
  uVar1 = 0xffffffff;
  if (-1 < (int)fft_size_00) {
    uVar1 = fft_size_00;
  }
  for (uVar13 = 0; uVar1 + 1 != uVar13; uVar13 = uVar13 + 1) {
    dVar21 = anon_unknown.dwarf_e3c::FrequencyToMel(((double)(int)uVar13 * (double)fs) / __x);
    x[uVar13] = dVar21;
  }
  forward_real_fft.forward_fft.ip = (int *)0x0;
  forward_real_fft.forward_fft.w = (double *)0x0;
  forward_real_fft.forward_fft.out = (double *)0x0;
  forward_real_fft.forward_fft.input = (double *)0x0;
  forward_real_fft.forward_fft.in = (double *)0x0;
  forward_real_fft.forward_fft.c_out = (fft_complex *)0x0;
  forward_real_fft.forward_fft.flags = 0;
  forward_real_fft.forward_fft._12_4_ = 0;
  forward_real_fft.forward_fft.c_in = (fft_complex *)0x0;
  forward_real_fft.spectrum = (fft_complex *)0x0;
  forward_real_fft.forward_fft.n = 0;
  forward_real_fft.forward_fft.sign = 0;
  forward_real_fft.fft_size = 0;
  forward_real_fft._4_4_ = 0;
  forward_real_fft.waveform = (double *)0x0;
  InitializeForwardRealFFT(fft_size_00,&forward_real_fft);
  uVar13 = (ulong)fft_size_00 << 3;
  if (fft_size < -1) {
    uVar13 = 0xffffffffffffffff;
  }
  uVar1 = fft_size / 4;
  uVar12 = 0;
  uVar15 = 0;
  if (0 < (int)uVar1) {
    uVar15 = (ulong)uVar1;
  }
  uVar3 = (ulong)(uint)number_of_dimensions;
  if (number_of_dimensions < 1) {
    uVar3 = uVar12;
  }
  uVar14 = 0;
  if (0 < (int)x_length) {
    uVar14 = (ulong)x_length;
  }
  uVar4 = (ulong)(uint)f0_length;
  if (f0_length < 1) {
    uVar4 = 0;
  }
  for (; uVar12 != uVar4; uVar12 = uVar12 + 1) {
    for (uVar7 = 0; uVar14 != uVar7; uVar7 = uVar7 + 1) {
      dVar21 = log(spectrogram[uVar12][uVar7]);
      y[uVar7] = dVar21;
    }
    pdVar11 = coded_spectral_envelope[uVar12];
    yi = (double *)operator_new__(uVar13);
    interp1(x,y,x_length,xi,fft_size_00,yi);
    pdVar5 = yi + lVar6 + -1;
    for (lVar8 = 0; uVar15 * 8 != lVar8; lVar8 = lVar8 + 8) {
      *(undefined8 *)((long)forward_real_fft.waveform + lVar8) =
           *(undefined8 *)((long)yi + lVar8 * 2);
      *(double *)((long)forward_real_fft.waveform + lVar8 + (long)(int)uVar1 * 8) = *pdVar5;
      pdVar5 = pdVar5 + -2;
    }
    pfVar9 = &forward_real_fft.forward_fft;
    puVar10 = (undefined8 *)&stack0xfffffffffffffe98;
    for (lVar8 = 9; lVar8 != 0; lVar8 = lVar8 + -1) {
      *puVar10 = *(undefined8 *)pfVar9;
      pfVar9 = (fft_plan *)((long)pfVar9 + (ulong)bVar16 * -0x10 + 8);
      puVar10 = puVar10 + (ulong)bVar16 * -2 + 1;
    }
    fft_execute(in_stack_fffffffffffffe98);
    dVar21 = (double)forward_real_fft.fft_size;
    if (dVar21 < 0.0) {
      dVar21 = sqrt(dVar21);
    }
    else {
      dVar21 = SQRT(dVar21);
    }
    for (lVar8 = 0; uVar3 << 3 != lVar8; lVar8 = lVar8 + 8) {
      *(double *)((long)pdVar11 + lVar8) =
           (*(double *)((long)*forward_real_fft.spectrum + lVar8 * 2) *
            *(double *)((long)pdVar2 + lVar8 * 2) -
           *(double *)((long)pdVar2 + lVar8 * 2 + 8) *
           *(double *)((long)*forward_real_fft.spectrum + lVar8 * 2 + 8)) / dVar21;
    }
    operator_delete__(yi);
  }
  DestroyForwardRealFFT(&forward_real_fft);
  operator_delete__(pdVar2);
  operator_delete__(y);
  operator_delete__(x);
  operator_delete__(xi);
  return;
}

Assistant:

void CodeSpectralEnvelope(const double * const *spectrogram, int f0_length,
    int fs, int fft_size, int number_of_dimensions,
    double **coded_spectral_envelope) {
  double *mel_axis = new double[fft_size / 2];
  double *frequency_axis = new double[fft_size / 2 + 1];
  double *tmp_spectrum = new double[fft_size / 2 + 1];
  fft_complex *weight = new fft_complex[fft_size / 2];

  // Generation of the required parameters
  GetParametersForCoding(world::kFloorFrequency,
      MyMinDouble(fs / 2.0, world::kCeilFrequency), fs, fft_size,
      mel_axis, frequency_axis, weight);

  ForwardRealFFT forward_real_fft = { 0 };
  InitializeForwardRealFFT(fft_size / 2, &forward_real_fft);

  for (int i = 0; i < f0_length; ++i) {
    for (int j = 0; j < fft_size / 2 + 1; ++j)
      tmp_spectrum[j] = log(spectrogram[i][j]);
    CodeOneFrame(tmp_spectrum, frequency_axis, fft_size, mel_axis, weight,
        fft_size / 2, number_of_dimensions, &forward_real_fft,
        coded_spectral_envelope[i]);
  }

  DestroyForwardRealFFT(&forward_real_fft);
  delete[] weight;
  delete[] tmp_spectrum;
  delete[] frequency_axis;
  delete[] mel_axis;
}